

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-lexer.cc
# Opt level: O1

Token * __thiscall wabt::WastLexer::GetInfToken(Token *__return_storage_ptr__,WastLexer *this)

{
  int iVar1;
  byte *pbVar2;
  long lVar3;
  byte *pbVar4;
  byte *pbVar5;
  uint uVar6;
  bool bVar7;
  
  pbVar2 = (byte *)this->cursor_;
  bVar7 = false;
  lVar3 = 0;
  pbVar4 = pbVar2;
  while( true ) {
    uVar6 = 0xffffffff;
    pbVar5 = pbVar4;
    if (pbVar4 < this->buffer_end_) {
      pbVar5 = pbVar4 + 1;
      this->cursor_ = (char *)pbVar5;
      uVar6 = (uint)*pbVar4;
    }
    if (uVar6 != (int)"inf"[lVar3]) break;
    lVar3 = lVar3 + 1;
    bVar7 = lVar3 == 3;
    pbVar4 = pbVar5;
    if (bVar7) {
LAB_0016313d:
      if (bVar7) {
        pbVar2 = (byte *)this->cursor_;
        iVar1 = 0;
        while( true ) {
          if (pbVar2 < this->buffer_end_) {
            lVar3 = (ulong)*pbVar2 + 1;
          }
          else {
            lVar3 = 0;
          }
          if ((""[lVar3] & 1U) == 0) break;
          if (pbVar2 < this->buffer_end_) {
            pbVar2 = pbVar2 + 1;
            this->cursor_ = (char *)pbVar2;
          }
          iVar1 = iVar1 + -1;
        }
        if (iVar1 == 0) {
          LiteralToken(__return_storage_ptr__,this,First_Literal,Infinity);
        }
        else {
          GetReservedToken(__return_storage_ptr__,this);
        }
      }
      else {
        GetKeywordToken(__return_storage_ptr__,this);
      }
      return __return_storage_ptr__;
    }
  }
  this->cursor_ = (char *)pbVar2;
  goto LAB_0016313d;
}

Assistant:

Token WastLexer::GetInfToken() {
  if (MatchString("inf")) {
    if (NoTrailingReservedChars()) {
      return LiteralToken(TokenType::Float, LiteralType::Infinity);
    }
    return GetReservedToken();
  }
  return GetKeywordToken();
}